

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O3

char * SUNGetErrMsg(SUNErrCode code)

{
  if (code + 9999U < 0x19) {
    return &DAT_0010c590 + *(int *)(&DAT_0010c590 + (ulong)(code + 9999U) * 4);
  }
  return "unknown error";
}

Assistant:

const char* SUNGetErrMsg(SUNErrCode code)
{
#define SUN_EXPAND_TO_CASES(name, description) \
  case name: return description; break;

  switch (code)
  {
    SUN_ERR_CODE_LIST(SUN_EXPAND_TO_CASES)
  default: return "unknown error";
  }

  return NULL;
}